

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O3

void __thiscall
iDynTree::Rotation::Rotation
          (Rotation *this,double xx,double xy,double xz,double yx,double yy,double yz,double zx,
          double zy,double zz)

{
  (this->super_Matrix3x3).m_data[0] = xx;
  (this->super_Matrix3x3).m_data[1] = xy;
  (this->super_Matrix3x3).m_data[2] = xz;
  (this->super_Matrix3x3).m_data[3] = yx;
  (this->super_Matrix3x3).m_data[4] = yy;
  (this->super_Matrix3x3).m_data[5] = yz;
  (this->super_Matrix3x3).m_data[6] = zx;
  (this->super_Matrix3x3).m_data[7] = zy;
  (this->super_Matrix3x3).m_data[8] = zz;
  return;
}

Assistant:

Rotation::Rotation(double xx, double xy, double xz,
                       double yx, double yy, double yz,
                       double zx, double zy, double zz)
    {
        this->m_data[0] = xx;
        this->m_data[1] = xy;
        this->m_data[2] = xz;
        this->m_data[3] = yx;
        this->m_data[4] = yy;
        this->m_data[5] = yz;
        this->m_data[6] = zx;
        this->m_data[7] = zy;
        this->m_data[8] = zz;
    }